

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O1

void Gia_ManSimInfoInit(Gia_ManSim_t *p)

{
  int iVar1;
  uint *puVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  long lVar5;
  long lVar6;
  
  pVVar4 = p->vCis2Ids;
  if (0 < pVVar4->nSize) {
    lVar5 = 0;
    do {
      if (pVVar4->pArray[lVar5] < p->pAig->vCis->nSize - p->pAig->nRegs) {
        iVar1 = p->nWords;
        if (0 < (long)iVar1) {
          puVar2 = p->pDataSimCis;
          lVar6 = (long)iVar1 + 1;
          do {
            uVar3 = Gia_ManRandom(0);
            puVar2[(long)(iVar1 * (int)lVar5) + lVar6 + -2] = uVar3;
            lVar6 = lVar6 + -1;
          } while (1 < lVar6);
        }
      }
      else {
        lVar6 = (long)p->nWords;
        if (0 < lVar6) {
          memset(p->pDataSimCis + lVar5 * lVar6,0,lVar6 << 2);
        }
      }
      lVar5 = lVar5 + 1;
      pVVar4 = p->vCis2Ids;
    } while (lVar5 < pVVar4->nSize);
  }
  return;
}

Assistant:

void Gia_ManSimInfoInit( Gia_ManSim_t * p )
{
    int iPioNum, i;
    Vec_IntForEachEntry( p->vCis2Ids, iPioNum, i )
    {
        if ( iPioNum < Gia_ManPiNum(p->pAig) )
            Gia_ManSimInfoRandom( p, Gia_SimDataCi(p, i) );
        else
            Gia_ManSimInfoZero( p, Gia_SimDataCi(p, i) );
    }
}